

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
* __thiscall
Catch::ExprLhs<trng::lagfib2plus<unsigned_int,168u,521u>const&>::operator!=
          (ExprLhs<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&> *this,
          lagfib2plus<unsigned_int,_168U,_521U> *rhs)

{
  StringRef op;
  bool comparisonResult;
  lagfib2plus<unsigned_int,_168U,_521U> *in_RSI;
  BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
  *in_RDI;
  lagfib2plus<unsigned_int,_168U,_521U> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
  *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareNotEqual<trng::lagfib2plus<unsigned_int,168u,521u>,trng::lagfib2plus<unsigned_int,168u,521u>const&>
                 (in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)(in_RSI->S).r;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&,_const_trng::lagfib2plus<unsigned_int,_168U,_521U>_&>
  ::BinaryExpr(in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }